

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readandsynthesis.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int y_length;
  char *pcVar2;
  double *f0;
  double *temporal_positions;
  double **spectrogram;
  double **aperiodicity;
  double *pdVar3;
  double **ppdVar4;
  char cVar5;
  int i_1;
  uint uVar6;
  char **ppcVar7;
  ulong uVar8;
  int i_2;
  int fs;
  ulong uVar9;
  ulong uVar10;
  int i;
  uint f0_length;
  double dVar11;
  double dVar12;
  char filename [200];
  
  iVar1 = 0;
  if (1 < argc) {
    pcVar2 = argv[1];
    if (((*pcVar2 == '-') && (pcVar2[1] == 'h')) && (pcVar2[2] == '\0')) {
      anon_unknown.dwarf_10c::usage(*argv);
      iVar1 = -1;
    }
    else {
      dVar11 = GetHeaderInformation(pcVar2,"NOF ");
      f0_length = (uint)dVar11;
      dVar11 = GetHeaderInformation(argv[2],"FFT ");
      iVar1 = (int)dVar11;
      dVar11 = GetHeaderInformation(argv[2],"FS  ");
      fs = (int)dVar11;
      dVar11 = GetHeaderInformation(argv[2],"FP  ");
      memcpy(filename,"output.wav",200);
      ppcVar7 = argv + (argc - 1);
      for (; argc != 1; argc = argc - 1) {
        pcVar2 = *ppcVar7;
        if (*pcVar2 == '-') {
          cVar5 = pcVar2[1];
          if (cVar5 == 'o') {
            if (pcVar2[2] == '\0') {
              snprintf(filename,200,argv[(uint)argc]);
              pcVar2 = *ppcVar7;
              if (*pcVar2 == '-') {
                cVar5 = pcVar2[1];
                goto LAB_001013d9;
              }
            }
          }
          else {
LAB_001013d9:
            if ((cVar5 == 'h') && (pcVar2[2] == '\0')) {
              anon_unknown.dwarf_10c::usage(*argv);
              goto LAB_0010170e;
            }
          }
        }
        ppcVar7 = ppcVar7 + -1;
      }
      uVar10 = 0;
      uVar8 = (long)(int)f0_length * 8;
      if ((int)f0_length < 0) {
        uVar8 = 0xffffffffffffffff;
      }
      uVar9 = 0;
      if (0 < (int)f0_length) {
        uVar9 = (ulong)f0_length;
      }
      f0 = (double *)operator_new__(uVar8);
      temporal_positions = (double *)operator_new__(uVar8);
      spectrogram = (double **)operator_new__(uVar8);
      aperiodicity = (double **)operator_new__(uVar8);
      uVar8 = (long)(iVar1 / 2) * 8 + 8;
      if (iVar1 < -3) {
        uVar8 = 0xffffffffffffffff;
      }
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        pdVar3 = (double *)operator_new__(uVar8);
        spectrogram[uVar10] = pdVar3;
        pdVar3 = (double *)operator_new__(uVar8);
        aperiodicity[uVar10] = pdVar3;
      }
      ReadF0(argv[1],temporal_positions,f0);
      dVar12 = GetHeaderInformation(argv[2],"NOD ");
      uVar6 = (uint)dVar12;
      pcVar2 = argv[2];
      if (uVar6 == 0) {
        ReadSpectralEnvelope(pcVar2,spectrogram);
      }
      else {
        uVar8 = (ulong)f0_length * 8;
        if ((int)f0_length < 0) {
          uVar8 = 0xffffffffffffffff;
        }
        ppdVar4 = (double **)operator_new__(uVar8);
        uVar8 = (ulong)uVar6 << 3;
        if ((int)uVar6 < 0) {
          uVar8 = 0xffffffffffffffff;
        }
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          pdVar3 = (double *)operator_new__(uVar8);
          ppdVar4[uVar10] = pdVar3;
        }
        ReadSpectralEnvelope(pcVar2,ppdVar4);
        DecodeSpectralEnvelope(ppdVar4,f0_length,fs,iVar1,uVar6,spectrogram);
        for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          if (ppdVar4[uVar8] != (double *)0x0) {
            operator_delete__(ppdVar4[uVar8]);
          }
        }
        operator_delete__(ppdVar4);
      }
      dVar12 = GetHeaderInformation(argv[3],"NOD ");
      uVar6 = (uint)dVar12;
      pcVar2 = argv[3];
      if (uVar6 == 0) {
        ReadAperiodicity(pcVar2,aperiodicity);
      }
      else {
        uVar8 = (ulong)f0_length << 3;
        if ((int)f0_length < 0) {
          uVar8 = 0xffffffffffffffff;
        }
        ppdVar4 = (double **)operator_new__(uVar8);
        uVar8 = (ulong)uVar6 << 3;
        if ((int)uVar6 < 0) {
          uVar8 = 0xffffffffffffffff;
        }
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          pdVar3 = (double *)operator_new__(uVar8);
          ppdVar4[uVar10] = pdVar3;
        }
        ReadAperiodicity(pcVar2,ppdVar4);
        DecodeAperiodicity(ppdVar4,f0_length,fs,iVar1,aperiodicity);
        for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          if (ppdVar4[uVar8] != (double *)0x0) {
            operator_delete__(ppdVar4[uVar8]);
          }
        }
        operator_delete__(ppdVar4);
      }
      y_length = (int)((double)fs * ((dVar11 * (double)(int)f0_length) / 1000.0));
      uVar8 = (long)y_length * 8;
      if (y_length < 0) {
        uVar8 = 0xffffffffffffffff;
      }
      pdVar3 = (double *)operator_new__(uVar8);
      Synthesis(f0,f0_length,spectrogram,aperiodicity,iVar1,dVar11,fs,y_length,pdVar3);
      wavwrite(pdVar3,y_length,fs,0x10,filename);
      operator_delete__(pdVar3);
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        if (spectrogram[uVar8] != (double *)0x0) {
          operator_delete__(spectrogram[uVar8]);
        }
        if (aperiodicity[uVar8] != (double *)0x0) {
          operator_delete__(aperiodicity[uVar8]);
        }
      }
      operator_delete__(spectrogram);
      operator_delete__(aperiodicity);
      operator_delete__(f0);
      operator_delete__(temporal_positions);
LAB_0010170e:
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  // Command check
  if (argc < 2) return 0;
  if (0 == strcmp(argv[1], "-h")) {
    usage(argv[0]);
    return -1;
  }

  // Get parameters required for memory allocation
  int f0_length = static_cast<int>(GetHeaderInformation(argv[1], "NOF "));
  int fft_size = static_cast<int>(GetHeaderInformation(argv[2], "FFT "));
  int fs = static_cast<int>(GetHeaderInformation(argv[2], "FS  "));
  double frame_period = GetHeaderInformation(argv[2], "FP  ");
  char filename[200] = "output.wav";

  // Option from command line
  if (SetOption(argc, argv, filename) == 0) return 0;

  // Memory allocation
  double *f0 = new double[f0_length];
  double *temporal_positions = new double[f0_length];
  double **spectrogram = new double *[f0_length];
  double **aperiodicity = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i) {
    spectrogram[i] = new double[fft_size / 2 + 1];
    aperiodicity[i] = new double[fft_size / 2 + 1];
  }

  // Read F0
  ReadF0(argv[1], temporal_positions, f0);

  // Read spectral envelope
  int number_of_dimensions =
    static_cast<int>(GetHeaderInformation(argv[2], "NOD "));
  if (number_of_dimensions == 0) {
    // If the spectral envelope is not coded.
    ReadSpectralEnvelope(argv[2], spectrogram);
  } else {
    // If the spectral envelope is coded.
    ReadCodedSpectralEnvelope(argv[2], f0_length, fs, fft_size,
      number_of_dimensions, spectrogram);
  }

  // Read aperiodicity
  number_of_dimensions =
    static_cast<int>(GetHeaderInformation(argv[3], "NOD "));
  if (number_of_dimensions == 0) {
    // If the aperiodicity is not coded.
    ReadAperiodicity(argv[3], aperiodicity);
  } else {
    // If the aperiodicity is coded.
    ReadCodedAperiodicity(argv[3], f0_length, fs, fft_size,
        number_of_dimensions, aperiodicity);
  }

  // Synthesis
  int y_length = static_cast<int>(f0_length * frame_period / 1000.0 * fs);
  double *y = new double[y_length];
  Synthesis(f0, f0_length, spectrogram, aperiodicity, fft_size, frame_period,
      fs, y_length, y);

  // File output
  wavwrite(y, y_length, fs, 16, filename);

  // Memory deallocation
  delete[] y;
  for (int i = 0; i < f0_length; ++i) {
    delete[] spectrogram[i];
    delete[] aperiodicity[i];
  }
  delete[] spectrogram;
  delete[] aperiodicity;
  delete[] f0;
  delete[] temporal_positions;
  return 0;
}